

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O0

void __thiscall level_info_t::~level_info_t(level_info_t *this)

{
  level_info_t *this_local;
  
  ClearSnapshot(this);
  ClearDefered(this);
  TArray<FName,_FName>::~TArray(&this->PrecacheClasses);
  TArray<FString,_FString>::~TArray(&this->PrecacheTextures);
  TArray<FSoundID,_FSoundID>::~TArray(&this->PrecacheSounds);
  TArray<FSpecialAction,_FSpecialAction>::~TArray(&this->specialactions);
  TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::~TMap(&this->MusicMap);
  TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
  ~TMap(&this->optdata);
  FString::~FString(&this->SndSeq);
  FString::~FString(&this->SoundInfo);
  FString::~FString(&this->InterMusic);
  FString::~FString(&this->ExitPic);
  FString::~FString(&this->EnterPic);
  FString::~FString(&this->RedirectMapName);
  FString::~FString(&this->Translator);
  FString::~FString(&this->LevelName);
  FString::~FString(&this->Music);
  FString::~FString(&this->MapBackground);
  FString::~FString(&this->BorderTexture);
  FString::~FString(&this->F1Pic);
  FString::~FString(&this->FadeTable);
  FString::~FString(&this->SkyPic2);
  FString::~FString(&this->SkyPic1);
  FString::~FString(&this->PName);
  FString::~FString(&this->NextSecretMap);
  FString::~FString(&this->NextMap);
  FString::~FString(&this->MapName);
  return;
}

Assistant:

~level_info_t()
	{
		ClearSnapshot(); 
		ClearDefered();
	}